

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::calcRootLogLikelihoodsByPartition
          (BeagleCPU4StateImpl<float,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *cumulativeScaleIndices,int *partitionIndices,
          int partitionCount,double *outSumLogLikelihoodByPartition)

{
  int iVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  float **ppfVar7;
  float **ppfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  undefined1 auVar12 [16];
  long lVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  
  piVar6 = (this->super_BeagleCPUImpl<float,_1,_0>).gPatternPartitionsStartPatterns;
  ppfVar7 = (this->super_BeagleCPUImpl<float,_1,_0>).gCategoryWeights;
  ppfVar8 = (this->super_BeagleCPUImpl<float,_1,_0>).gPartials;
  iVar3 = (this->super_BeagleCPUImpl<float,_1,_0>).kCategoryCount;
  for (uVar15 = 0; uVar15 != (uint)(~(partitionCount >> 0x1f) & partitionCount); uVar15 = uVar15 + 1
      ) {
    lVar20 = 0;
    iVar4 = piVar6[partitionIndices[uVar15]];
    iVar5 = piVar6[(long)partitionIndices[uVar15] + 1];
    pfVar9 = ppfVar8[bufferIndices[uVar15]];
    pfVar10 = (this->super_BeagleCPUImpl<float,_1,_0>).integrationTmp;
    pfVar11 = ppfVar7[categoryWeightsIndices[uVar15]];
    iVar1 = iVar4 * 4;
    fVar2 = *pfVar11;
    for (iVar16 = iVar4; iVar16 < iVar5; iVar16 = iVar16 + 1) {
      pfVar10[iVar1 + lVar20] = fVar2 * pfVar9[iVar1 + lVar20];
      pfVar10[(long)iVar1 + lVar20 + 1] = fVar2 * pfVar9[(long)iVar1 + lVar20 + 1];
      pfVar10[(long)iVar1 + lVar20 + 2] = fVar2 * pfVar9[(long)iVar1 + lVar20 + 2];
      pfVar10[(long)iVar1 + lVar20 + 3] = fVar2 * pfVar9[(long)iVar1 + lVar20 + 3];
      lVar20 = lVar20 + 4;
    }
    iVar16 = (this->super_BeagleCPUImpl<float,_1,_0>).kExtraPatterns;
    iVar19 = (int)lVar20 + iVar1;
    iVar17 = ((iVar4 - iVar5) + (this->super_BeagleCPUImpl<float,_1,_0>).kPatternCount) * 4;
    for (lVar20 = 1; lVar20 < iVar3; lVar20 = lVar20 + 1) {
      fVar2 = pfVar11[lVar20];
      pfVar10 = (this->super_BeagleCPUImpl<float,_1,_0>).integrationTmp;
      lVar13 = (long)(iVar17 + iVar19);
      lVar14 = 0;
      iVar18 = iVar4;
      while (iVar18 < iVar5) {
        iVar18 = iVar18 + 1;
        auVar12 = vfmadd213ss_fma(ZEXT416((uint)pfVar9[lVar13 + lVar14]),ZEXT416((uint)fVar2),
                                  ZEXT416((uint)pfVar10[iVar1 + lVar14]));
        pfVar10[iVar1 + lVar14] = auVar12._0_4_;
        auVar12 = vfmadd213ss_fma(ZEXT416((uint)pfVar9[lVar13 + lVar14 + 1]),ZEXT416((uint)fVar2),
                                  ZEXT416((uint)pfVar10[(long)iVar1 + lVar14 + 1]));
        pfVar10[(long)iVar1 + lVar14 + 1] = auVar12._0_4_;
        auVar12 = vfmadd213ss_fma(ZEXT416((uint)pfVar9[lVar13 + lVar14 + 2]),ZEXT416((uint)fVar2),
                                  ZEXT416((uint)pfVar10[(long)iVar1 + lVar14 + 2]));
        pfVar10[(long)iVar1 + lVar14 + 2] = auVar12._0_4_;
        auVar12 = vfmadd213ss_fma(ZEXT416((uint)pfVar9[lVar13 + lVar14 + 3]),ZEXT416((uint)fVar2),
                                  ZEXT416((uint)pfVar10[(long)iVar1 + lVar14 + 3]));
        pfVar10[(long)iVar1 + lVar14 + 3] = auVar12._0_4_;
        lVar14 = lVar14 + 4;
      }
      iVar19 = (int)lVar14 + iVar19 + iVar17 + iVar16 * 4;
    }
  }
  integrateOutStatesAndScaleByPartition
            (this,(this->super_BeagleCPUImpl<float,_1,_0>).integrationTmp,stateFrequenciesIndices,
             cumulativeScaleIndices,partitionIndices,partitionCount,outSumLogLikelihoodByPartition);
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsByPartition(
                                                                    const int* bufferIndices,
                                                                    const int* categoryWeightsIndices,
                                                                    const int* stateFrequenciesIndices,
                                                                    const int* cumulativeScaleIndices,
                                                                    const int* partitionIndices,
                                                                    int partitionCount,
                                                                    double* outSumLogLikelihoodByPartition) {


    for (int p = 0; p < partitionCount; p++) {
        int pIndex = partitionIndices[p];

        int startPattern = gPatternPartitionsStartPatterns[pIndex];
        int endPattern = gPatternPartitionsStartPatterns[pIndex + 1];

        const REALTYPE* rootPartials = gPartials[bufferIndices[p]];
        assert(rootPartials);
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndices[p]];

        int v = startPattern * 4;
        const REALTYPE wt0 = wt[0];
        for (int k = startPattern; k < endPattern; k++) {
            integrationTmp[v    ] = rootPartials[v    ] * wt0;
            integrationTmp[v + 1] = rootPartials[v + 1] * wt0;
            integrationTmp[v + 2] = rootPartials[v + 2] * wt0;
            integrationTmp[v + 3] = rootPartials[v + 3] * wt0;
            v += 4;
        }
        for (int l = 1; l < kCategoryCount; l++) {
            int u = startPattern * 4;
            v += ((kPatternCount - endPattern) + startPattern) * 4;
            const REALTYPE wtl = wt[l];
            for (int k = startPattern; k < endPattern; k++) {
                integrationTmp[u    ] += rootPartials[v    ] * wtl;
                integrationTmp[u + 1] += rootPartials[v + 1] * wtl;
                integrationTmp[u + 2] += rootPartials[v + 2] * wtl;
                integrationTmp[u + 3] += rootPartials[v + 3] * wtl;

                u += 4;
                v += 4;
            }
        v += 4 * kExtraPatterns;
        }
    }
    integrateOutStatesAndScaleByPartition(integrationTmp, stateFrequenciesIndices, cumulativeScaleIndices, partitionIndices, partitionCount, outSumLogLikelihoodByPartition);
}